

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_mom.c
# Opt level: O3

ErrorNumber test_func_mom_roc(TA_History *history)

{
  TA_RetCode TVar1;
  ErrorNumber EVar2;
  ulong uVar3;
  TA_Test_conflict8 *pTVar4;
  uint local_48;
  uint local_44;
  TA_Test_conflict8 *local_40;
  TA_Real *local_38;
  
  pTVar4 = tableTest;
  uVar3 = 0;
  while( true ) {
    if ((int)history->nbBars < pTVar4->expectedNbElement) {
      printf("%s Failed Bad Parameter for Test #%d (%d,%d)\n",
             "/workspace/llm4binary/github/license_c_cmakelists/TA-Lib[P]ta-lib/src/tools/ta_regtest/ta_test_func/test_mom.c"
             ,uVar3 & 0xffffffff);
      return TA_TESTUTIL_TFRR_BAD_PARAM;
    }
    clearAllBuffers();
    setInputBuffer(0,history->close,history->nbBars);
    setInputBuffer(1,history->close,history->nbBars);
    local_44 = 0;
    local_48 = 0;
    switch(pTVar4->theFunction) {
    case TA_ANY_MA_TEST:
      TVar1 = TA_MOM(pTVar4->startIdx,pTVar4->endIdx,gBuffer[0].in,pTVar4->optInTimePeriod,
                     (int *)&local_44,(int *)&local_48,gBuffer[0].out0);
      break;
    case TA_AD_TEST:
      TVar1 = TA_ROC(pTVar4->startIdx,pTVar4->endIdx,gBuffer[0].in,pTVar4->optInTimePeriod,
                     (int *)&local_44,(int *)&local_48,gBuffer[0].out0);
      break;
    case TA_ADOSC_3_10_TEST:
      TVar1 = TA_ROCP(pTVar4->startIdx,pTVar4->endIdx,gBuffer[0].in,pTVar4->optInTimePeriod,
                      (int *)&local_44,(int *)&local_48,gBuffer[0].out0);
      break;
    case TA_ADOSC_5_2_TEST:
      TVar1 = TA_ROCR(pTVar4->startIdx,pTVar4->endIdx,gBuffer[0].in,pTVar4->optInTimePeriod,
                      (int *)&local_44,(int *)&local_48,gBuffer[0].out0);
      break;
    case TA_ACCBANDS_TEST:
      TVar1 = TA_ROCR100(pTVar4->startIdx,pTVar4->endIdx,gBuffer[0].in,pTVar4->optInTimePeriod,
                         (int *)&local_44,(int *)&local_48,gBuffer[0].out0);
      break;
    default:
      TVar1 = TA_BAD_PARAM;
    }
    EVar2 = checkDataSame(gBuffer[0].in,history->close,history->nbBars);
    if (EVar2 != TA_TEST_PASS) goto LAB_001182a4;
    EVar2 = checkExpectedValue(gBuffer[0].out0,TVar1,pTVar4->expectedRetCode,local_44,
                               pTVar4->expectedBegIdx,local_48,pTVar4->expectedNbElement,
                               pTVar4->oneOfTheExpectedOutReal0,
                               pTVar4->oneOfTheExpectedOutRealIndex0);
    if (EVar2 != TA_TEST_PASS) break;
    local_44 = 0;
    local_48 = 0;
    switch(pTVar4->theFunction) {
    case TA_ANY_MA_TEST:
      TVar1 = TA_MOM(pTVar4->startIdx,pTVar4->endIdx,gBuffer[1].in,pTVar4->optInTimePeriod,
                     (int *)&local_44,(int *)&local_48,gBuffer[1].in);
      break;
    case TA_AD_TEST:
      TVar1 = TA_ROC(pTVar4->startIdx,pTVar4->endIdx,gBuffer[1].in,pTVar4->optInTimePeriod,
                     (int *)&local_44,(int *)&local_48,gBuffer[1].in);
      break;
    case TA_ADOSC_3_10_TEST:
      TVar1 = TA_ROCP(pTVar4->startIdx,pTVar4->endIdx,gBuffer[1].in,pTVar4->optInTimePeriod,
                      (int *)&local_44,(int *)&local_48,gBuffer[1].in);
      break;
    case TA_ADOSC_5_2_TEST:
      TVar1 = TA_ROCR(pTVar4->startIdx,pTVar4->endIdx,gBuffer[1].in,pTVar4->optInTimePeriod,
                      (int *)&local_44,(int *)&local_48,gBuffer[1].in);
      break;
    case TA_ACCBANDS_TEST:
      TVar1 = TA_ROCR100(pTVar4->startIdx,pTVar4->endIdx,gBuffer[1].in,pTVar4->optInTimePeriod,
                         (int *)&local_44,(int *)&local_48,gBuffer[1].in);
      break;
    default:
      TVar1 = 0x1407;
    }
    EVar2 = checkSameContent(gBuffer[0].out0,gBuffer[1].in);
    if (EVar2 != TA_TEST_PASS) goto LAB_001182a4;
    EVar2 = checkExpectedValue(gBuffer[1].in,TVar1,pTVar4->expectedRetCode,local_44,
                               pTVar4->expectedBegIdx,local_48,pTVar4->expectedNbElement,
                               pTVar4->oneOfTheExpectedOutReal0,
                               pTVar4->oneOfTheExpectedOutRealIndex0);
    if (EVar2 != TA_TEST_PASS) break;
    local_38 = history->close;
    local_40 = pTVar4;
    if ((pTVar4->doRangeTestFlag != 0) &&
       (EVar2 = doRangeTest(rangeTestFunction,TA_FUNC_UNST_NONE,&local_40,1,0),
       EVar2 != TA_TEST_PASS)) goto LAB_001182a4;
    uVar3 = uVar3 + 1;
    pTVar4 = pTVar4 + 1;
    if (uVar3 == 0x3f) {
      return TA_TEST_PASS;
    }
  }
  printf("Fail for output id=%d\n",0);
LAB_001182a4:
  printf("%s Failed Test #%d (Code=%d)\n",
         "/workspace/llm4binary/github/license_c_cmakelists/TA-Lib[P]ta-lib/src/tools/ta_regtest/ta_test_func/test_mom.c"
         ,uVar3 & 0xffffffff,(ulong)EVar2);
  return EVar2;
}

Assistant:

ErrorNumber test_func_mom_roc( TA_History *history )
{
   unsigned int i;
   ErrorNumber retValue;

   for( i=0; i < NB_TEST; i++ )
   {
      if( (int)tableTest[i].expectedNbElement > (int)history->nbBars )
      {
         printf( "%s Failed Bad Parameter for Test #%d (%d,%d)\n", __FILE__,
                 i, tableTest[i].expectedNbElement, history->nbBars );
         return TA_TESTUTIL_TFRR_BAD_PARAM;
      }

      retValue = do_test( history, &tableTest[i] );
      if( retValue != 0 )
      {
         printf( "%s Failed Test #%d (Code=%d)\n", __FILE__,
                 i, retValue );
         return retValue;
      }
   }

   /* All test succeed. */
   return TA_TEST_PASS;
}